

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_mset.pb.h
# Opt level: O0

NestedTestInt * __thiscall
proto2_unittest::TestMessageSetExtension3::_internal_mutable_msg(TestMessageSetExtension3 *this)

{
  Arena *arena;
  NestedTestInt *pNVar1;
  NestedTestInt *p;
  TestMessageSetExtension3 *this_local;
  
  if ((this->field_0)._impl_.msg_ == (NestedTestInt *)0x0) {
    arena = google::protobuf::MessageLite::GetArena((MessageLite *)this);
    pNVar1 = (NestedTestInt *)
             google::protobuf::Arena::DefaultConstruct<proto2_unittest::NestedTestInt>(arena);
    (this->field_0)._impl_.msg_ = pNVar1;
  }
  return (this->field_0)._impl_.msg_;
}

Assistant:

inline ::proto2_unittest::NestedTestInt* PROTOBUF_NONNULL TestMessageSetExtension3::_internal_mutable_msg() {
  ::google::protobuf::internal::TSanWrite(&_impl_);
  if (_impl_.msg_ == nullptr) {
    auto* p = ::google::protobuf::Message::DefaultConstruct<::proto2_unittest::NestedTestInt>(GetArena());
    _impl_.msg_ = reinterpret_cast<::proto2_unittest::NestedTestInt*>(p);
  }
  return _impl_.msg_;
}